

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setAttributeClientMem
          (Program *this,void *attrData,VarSpec *attrSpec,string *shaderNameManglingSuffix)

{
  GLuint GVar1;
  int size;
  string local_40;
  
  GVar1 = this->m_programGL;
  mangleShaderNames(&local_40,&attrSpec->name,shaderNameManglingSuffix);
  GVar1 = glwGetAttribLocation(GVar1,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glwEnableVertexAttribArray(GVar1);
  glwBindBuffer(0x8892,0);
  if (attrSpec->type - TYPE_FLOAT < 4) {
    size = glu::getDataTypeScalarSize(attrSpec->type);
    glwVertexAttribPointer(GVar1,size,0x1406,'\0',0,attrData);
  }
  return;
}

Assistant:

void Program::setAttributeClientMem (const void* const attrData, const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glEnableVertexAttribArray(attrLoc);
	glBindBuffer(GL_ARRAY_BUFFER, 0);

	if (glu::isDataTypeFloatOrVec(attrSpec.type))
		glVertexAttribPointer(attrLoc, glu::getDataTypeScalarSize(attrSpec.type), GL_FLOAT, GL_FALSE, 0, attrData);
	else
		DE_ASSERT(false);
}